

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

BOOL TerminateProcess(HANDLE hProcess,UINT uExitCode)

{
  BOOL BVar1;
  BOOL ret;
  UINT uExitCode_local;
  HANDLE hProcess_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  BVar1 = PROCEndProcess(hProcess,uExitCode,1);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return BVar1;
}

Assistant:

BOOL
PALAPI
TerminateProcess(
    IN HANDLE hProcess,
    IN UINT uExitCode)
{
    BOOL ret;

    PERF_ENTRY(TerminateProcess);
    ENTRY("TerminateProcess(hProcess=%p, uExitCode=%u)\n",hProcess, uExitCode );

    ret = PROCEndProcess(hProcess, uExitCode, TRUE);

    LOGEXIT("TerminateProcess returns BOOL %d\n", ret);
    PERF_EXIT(TerminateProcess);
    return ret;
}